

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.hpp
# Opt level: O2

void __thiscall
ItemSourceShop::ItemSourceShop
          (ItemSourceShop *this,string *name,vector<Entity_*,_std::allocator<Entity_*>_> *entities,
          uint8_t shop_item_id,string *node_id,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *hints)

{
  allocator<char> local_49;
  _Vector_base<Entity_*,_std::allocator<Entity_*>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_48._M_impl.super__Vector_impl_data._M_start =
       (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ItemSourceOnGround::ItemSourceOnGround
            (&this->super_ItemSourceOnGround,name,
             (vector<Entity_*,_std::allocator<Entity_*>_> *)&local_48,shop_item_id,node_id,hints,
             false);
  std::_Vector_base<Entity_*,_std::allocator<Entity_*>_>::~_Vector_base(&local_48);
  (this->super_ItemSourceOnGround).super_ItemSource._vptr_ItemSource =
       (_func_int **)&PTR__ItemSourceOnGround_002467a0;
  *(undefined2 *)&(this->super_ItemSourceOnGround).field_0x82 = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"owned by someone trying to make profit out of it",&local_49);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_ItemSourceOnGround).super_ItemSource._hints,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ItemSourceShop(const std::string& name, std::vector<Entity*> entities, uint8_t shop_item_id, const std::string& node_id = "",
                    const std::vector<std::string>& hints = {}) :
        ItemSourceOnGround (name, std::move(entities), shop_item_id, node_id, hints, false)
    {
        this->add_hint("owned by someone trying to make profit out of it");
    }